

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateArray(ExpressionEvalContext *ctx,ExprArray *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *value;
  undefined4 extraout_var_00;
  TypeRef *type;
  ExprBase *pEVar5;
  uchar *ptr;
  uint uVar6;
  TypeBase *pTVar7;
  
  uVar6 = (ctx->stackFrames).count;
  if ((uVar6 == 0) || ((ctx->stackFrames).data[uVar6 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      target = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                   (expression->super_ExprBase).type);
      if (target != (ExprPointerLiteral *)0x0) {
        pTVar7 = (expression->super_ExprBase).type;
        if ((pTVar7 == (TypeBase *)0x0) || (pTVar7->typeID != 0x13)) {
          pTVar7 = (TypeBase *)0x0;
        }
        if (pTVar7 == (TypeBase *)0x0) {
          __assert_fail("arrayType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x3d5,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
        }
        pEVar5 = (expression->values).head;
        if (pEVar5 != (ExprBase *)0x0) {
          uVar6 = 0;
          do {
            value = Evaluate(ctx,pEVar5);
            if (value == (ExprBase *)0x0) {
              bVar3 = false;
            }
            else {
              ptr = target->ptr + uVar6;
              if (target->end < ptr + (long)pTVar7[1]._vptr_TypeBase[6]) {
                __assert_fail("storage->ptr + offset + arrayType->subType->size <= storage->end",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                              ,0x3e0,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)"
                             );
              }
              pAVar1 = ctx->ctx->allocator;
              iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
              pSVar2 = (expression->super_ExprBase).source;
              type = ExpressionContext::GetReferenceType
                               (ctx->ctx,(TypeBase *)pTVar7[1]._vptr_TypeBase);
              ExprPointerLiteral::ExprPointerLiteral
                        ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar4),pSVar2,
                         &type->super_TypeBase,ptr,ptr + (long)pTVar7[1]._vptr_TypeBase[6]);
              bVar3 = CreateStore(ctx,(ExprBase *)CONCAT44(extraout_var_00,iVar4),value);
              if (bVar3) {
                uVar6 = uVar6 + *(int *)(pTVar7[1]._vptr_TypeBase + 6);
              }
            }
            if (bVar3 == false) goto LAB_0014b27a;
            pEVar5 = pEVar5->next;
          } while (pEVar5 != (ExprBase *)0x0);
        }
        pEVar5 = CreateLoad(ctx,&target->super_ExprBase);
        if (pEVar5 != (ExprBase *)0x0) {
          pEVar5 = CheckType(&expression->super_ExprBase,pEVar5);
          return pEVar5;
        }
      }
    }
    else {
      Report(ctx,"ERROR: instruction limit reached");
    }
LAB_0014b27a:
    pEVar5 = (ExprBase *)0x0;
  }
  else {
    pAVar1 = ctx->ctx->allocator;
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar7 = ctx->ctx->typeVoid;
    pEVar5->typeID = 2;
    pEVar5->source = pSVar2;
    pEVar5->type = pTVar7;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
  }
  return pEVar5;
}

Assistant:

ExprBase* EvaluateArray(ExpressionEvalContext &ctx, ExprArray *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, expression->type);

	if(!storage)
		return NULL;

	TypeArray *arrayType = getType<TypeArray>(expression->type);

	assert(arrayType);

	unsigned offset = 0;

	for(ExprBase *value = expression->values.head; value; value = value->next)
	{
		ExprBase *element = Evaluate(ctx, value);

		if(!element)
			return NULL;

		assert(storage->ptr + offset + arrayType->subType->size <= storage->end);

		unsigned char *targetPtr = storage->ptr + offset;

		ExprPointerLiteral *target = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, target, element))
			return NULL;

		offset += unsigned(arrayType->subType->size);
	}

	ExprBase *load = CreateLoad(ctx, storage);

	if(!load)
		return NULL;

	return CheckType(expression, load);
}